

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bool-type.cpp
# Opt level: O3

Up __thiscall yactfr::FixedLengthBooleanType::_clone(FixedLengthBooleanType *this)

{
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  void *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Var1;
  BitOrder local_40;
  ByteOrder local_3c;
  uint local_38;
  uint local_34;
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_30;
  _func_int **local_28;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_20;
  
  local_34 = *(uint *)(in_RSI + 0xc);
  local_38 = *(uint *)(in_RSI + 0x18);
  local_3c = *(ByteOrder *)(in_RSI + 0x1c);
  local_40 = *(BitOrder *)(in_RSI + 0x20);
  if (*(__fn **)(in_RSI + 0x10) == (__fn *)0x0) {
    _Var1._M_head_impl = (MapItem *)0x0;
  }
  else {
    MapItem::clone((MapItem *)&stack0xffffffffffffffe0,*(__fn **)(in_RSI + 0x10),in_RDX,in_ECX,in_R8
                  );
    _Var1._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (MapItem *)0x0;
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &stack0xffffffffffffffe0);
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
       _Var1._M_head_impl;
  create<unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((FixedLengthBooleanType *)&local_28,&local_34,&local_38,&local_3c,&local_40,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_30);
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       local_28;
  local_28 = (_func_int **)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_30);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBooleanType::_clone() const
{
    return FixedLengthBooleanType::create(this->alignment(), this->length(), this->byteOrder(),
                                          this->bitOrder(),
                                          internal::tryCloneAttrs(this->attributes()));
}